

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastHugeDecimalToNumeric<signed_char>
          (duckdb *this,hugeint_t input,char *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  char *result_00;
  PhysicalType params_1;
  ulong uVar2;
  hugeint_t input_00;
  hugeint_t input_01;
  string error;
  hugeint_t power;
  string local_a8;
  string local_88 [32];
  hugeint_t local_68;
  hugeint_t input_local;
  hugeint_t local_48;
  hugeint_t rounding;
  
  input_01.upper = input.upper;
  input_local.upper = input.lower;
  uVar2 = (ulong)(uint)((int)parameters << 4);
  power.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + uVar2);
  power.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + uVar2 + 8);
  result_00 = result;
  input_local.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_68,0);
  params_1 = (PhysicalType)uVar2;
  bVar1 = hugeint_t::operator<(&input_local,&local_68);
  if (bVar1) {
    error._0_16_ = hugeint_t::operator-(&power);
  }
  else {
    error._M_string_length = power.upper;
    error._M_dataplus._M_p = (pointer)power.lower;
  }
  hugeint_t::hugeint_t(&local_48,2);
  rounding = hugeint_t::operator/((hugeint_t *)&error,&local_48);
  error._0_16_ = hugeint_t::operator+(&input_local,&rounding);
  input_00 = hugeint_t::operator/((hugeint_t *)&error,&power);
  input_01.lower = input_00.upper;
  bVar1 = Hugeint::TryCast<signed_char>((Hugeint *)input_00.lower,input_01,result_00);
  if (!bVar1) {
    ::std::__cxx11::string::string
              (local_88,"Failed to cast decimal value %s to type %s",(allocator *)&local_68);
    StandardStringCast<duckdb::hugeint_t>(&local_a8,input_00);
    StringUtil::Format<std::__cxx11::string,duckdb::PhysicalType>
              (&error,(StringUtil *)local_88,&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3,params_1);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string(local_88);
    HandleCastError::AssignError(&error,(CastParameters *)result);
    ::std::__cxx11::string::~string((string *)&error);
  }
  return bVar1;
}

Assistant:

bool TryCastHugeDecimalToNumeric(hugeint_t input, DST &result, CastParameters &parameters, uint8_t scale) {
	const auto power = Hugeint::POWERS_OF_TEN[scale];
	const auto rounding = ((input < 0) ? -power : power) / 2;
	auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<hugeint_t, DST>(scaled_value, result)) {
		string error = StringUtil::Format("Failed to cast decimal value %s to type %s",
		                                  ConvertToString::Operation(scaled_value), GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}